

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bus.c
# Opt level: O3

int nn_bus_create(void *hint,nn_sockbase **sockbase)

{
  int extraout_EAX;
  nn_xbus *self;
  nn_xbus *self_00;
  
  self_00 = (nn_xbus *)0x1b0;
  self = (nn_xbus *)nn_alloc_(0x1b0);
  if (self != (nn_xbus *)0x0) {
    nn_xbus_init(self,&nn_bus_sockbase_vfptr,hint);
    *sockbase = (nn_sockbase *)self;
    return 0;
  }
  nn_bus_create_cold_1();
  nn_xbus_term(self_00);
  nn_free(self_00);
  return extraout_EAX;
}

Assistant:

static int nn_bus_create (void *hint, struct nn_sockbase **sockbase)
{
    struct nn_bus *self;

    self = nn_alloc (sizeof (struct nn_bus), "socket (bus)");
    alloc_assert (self);
    nn_bus_init (self, &nn_bus_sockbase_vfptr, hint);
    *sockbase = &self->xbus.sockbase;

    return 0;
}